

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

Layer * getLayerForScale(Generator *g,int scale)

{
  int scale_local;
  Generator *g_local;
  Layer *local_8;
  
  if (g->mc < 0x16) {
    if (scale == 0) {
      local_8 = (g->field_5).field_0.entry;
    }
    else if (scale == 1) {
      local_8 = (g->field_5).field_0.ls.entry_1;
    }
    else if (scale == 4) {
      local_8 = (g->field_5).field_0.ls.entry_4;
    }
    else if (scale == 0x10) {
      local_8 = (g->field_5).field_0.ls.entry_16;
    }
    else if (scale == 0x40) {
      local_8 = (g->field_5).field_0.ls.entry_64;
    }
    else if (scale == 0x100) {
      local_8 = (g->field_5).field_0.ls.entry_256;
    }
    else {
      local_8 = (Layer *)0x0;
    }
  }
  else {
    local_8 = (Layer *)0x0;
  }
  return local_8;
}

Assistant:

const Layer *getLayerForScale(const Generator *g, int scale)
{
    if (g->mc > MC_1_17)
        return NULL;
    switch (scale)
    {
    case 0:   return g->entry;
    case 1:   return g->ls.entry_1;
    case 4:   return g->ls.entry_4;
    case 16:  return g->ls.entry_16;
    case 64:  return g->ls.entry_64;
    case 256: return g->ls.entry_256;
    default:
        return NULL;
    }
}